

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

Status __thiscall
leveldb::WriteBatchInternal::InsertInto(WriteBatchInternal *this,WriteBatch *b,MemTable *memtable)

{
  undefined1 local_38 [8];
  MemTableInserter inserter;
  MemTable *memtable_local;
  WriteBatch *b_local;
  
  inserter.mem_ = memtable;
  anon_unknown_11::MemTableInserter::MemTableInserter((MemTableInserter *)local_38);
  inserter.super_Handler._vptr_Handler = (_func_int **)Sequence(b);
  inserter.sequence_ = (SequenceNumber)inserter.mem_;
  WriteBatch::Iterate((WriteBatch *)this,(Handler *)b);
  anon_unknown_11::MemTableInserter::~MemTableInserter((MemTableInserter *)local_38);
  return (Status)(char *)this;
}

Assistant:

Status WriteBatchInternal::InsertInto(const WriteBatch* b, MemTable* memtable) {
  MemTableInserter inserter;
  inserter.sequence_ = WriteBatchInternal::Sequence(b);
  inserter.mem_ = memtable;
  return b->Iterate(&inserter);
}